

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_coletree.c
# Opt level: O0

int sp_coletree(int_t *acolst,int_t *acolend,int_t *arow,int nr,int nc,int *parent)

{
  int local_64;
  int *local_60;
  int *pp;
  int p;
  int rroot;
  int col;
  int row;
  int cset;
  int rset;
  int *firstcol;
  int *root;
  int *parent_local;
  int nc_local;
  int nr_local;
  int_t *arow_local;
  int_t *acolend_local;
  int_t *acolst_local;
  
  root = parent;
  parent_local._0_4_ = nc;
  parent_local._4_4_ = nr;
  _nc_local = arow;
  arow_local = acolend;
  acolend_local = acolst;
  firstcol = mxCallocInt(nc);
  initialize_disjoint_sets((int)parent_local,&local_60);
  _cset = mxCallocInt(parent_local._4_4_);
  rroot = 0;
  while (rroot < parent_local._4_4_) {
    _cset[rroot] = (int)parent_local;
    rroot = rroot + 1;
  }
  for (p = 0; p < (int)parent_local; p = p + 1) {
    for (pp._0_4_ = acolend_local[p]; (int)pp < arow_local[p]; pp._0_4_ = (int)pp + 1) {
      rroot = _nc_local[(int)pp];
      if (_cset[rroot] < p) {
        local_64 = _cset[rroot];
      }
      else {
        local_64 = p;
      }
      _cset[rroot] = local_64;
    }
  }
  for (p = 0; p < (int)parent_local; p = p + 1) {
    col = make_set(p,local_60);
    firstcol[col] = p;
    root[p] = (int)parent_local;
    for (pp._0_4_ = acolend_local[p]; (int)pp < arow_local[p]; pp._0_4_ = (int)pp + 1) {
      rroot = _cset[_nc_local[(int)pp]];
      if (rroot < p) {
        row = find(rroot,local_60);
        pp._4_4_ = firstcol[row];
        if (pp._4_4_ != p) {
          root[pp._4_4_] = p;
          col = link((char *)(ulong)(uint)col,(char *)(ulong)(uint)row);
          firstcol[col] = p;
        }
      }
    }
  }
  superlu_free(firstcol);
  superlu_free(_cset);
  finalize_disjoint_sets(local_60);
  return 0;
}

Assistant:

int sp_coletree(
                const int_t *acolst, const int_t *acolend, /* column start and end past 1 */
                const int_t *arow,                 /* row indices of A */
                int nr, int nc,            /* dimension of A */
                int *parent)               /* parent in elim tree */
{
	int	*root;			/* root of subtree of etree 	*/
	int     *firstcol;		/* first nonzero col in each row*/
	int	rset, cset;             
	int	row, col;
	int	rroot;
	int	p;
	int     *pp;

	root = mxCallocInt (nc);
	initialize_disjoint_sets (nc, &pp);

	/* Compute firstcol[row] = first nonzero column in row */

	firstcol = mxCallocInt (nr);
	for (row = 0; row < nr; firstcol[row++] = nc);
	for (col = 0; col < nc; col++) 
		for (p = acolst[col]; p < acolend[col]; p++) {
			row = arow[p];
			firstcol[row] = SUPERLU_MIN(firstcol[row], col);
		}

	/* Compute etree by Liu's algorithm for symmetric matrices,
           except use (firstcol[r],c) in place of an edge (r,c) of A.
	   Thus each row clique in A'*A is replaced by a star
	   centered at its first vertex, which has the same fill. */

	for (col = 0; col < nc; col++) {
		cset = make_set (col, pp);
		root[cset] = col;
		parent[col] = nc; /* Matlab */
		for (p = acolst[col]; p < acolend[col]; p++) {
			row = firstcol[arow[p]];
			if (row >= col) continue;
			rset = find (row, pp);
			rroot = root[rset];
			if (rroot != col) {
				parent[rroot] = col;
				cset = link (cset, rset, pp);
				root[cset] = col;
			}
		}
	}

	SUPERLU_FREE (root);
	SUPERLU_FREE (firstcol);
	finalize_disjoint_sets (pp);
	return 0;
}